

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::FindProvidesForFields
          (Generator *this,GeneratorOptions *options,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *provided)

{
  size_type *psVar1;
  ulong uVar2;
  _anonymous_namespace_ *this_00;
  int iVar3;
  pointer ppFVar4;
  long *plVar5;
  undefined8 *puVar6;
  FieldDescriptor *field;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  FieldDescriptor *local_a0;
  GeneratorOptions *local_98;
  ulong local_90;
  long lStack_88;
  string local_80;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_60;
  GeneratorOptions *local_58;
  string local_50;
  
  ppFVar4 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    uVar9 = 0;
    local_60 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)provided;
    local_58 = options;
    do {
      this_00 = (_anonymous_namespace_ *)ppFVar4[uVar9];
      if (this_00[0x50] == (_anonymous_namespace_)0x1) {
        iVar3 = std::__cxx11::string::compare
                          ((char *)**(undefined8 **)(*(long *)(this_00 + 0x58) + 0x10));
        if (iVar3 != 0) goto LAB_0021ddfd;
      }
      else {
LAB_0021ddfd:
        (anonymous_namespace)::GetFilePath_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(local_58->namespace_prefix)._M_dataplus._M_p,
                   (GeneratorOptions *)(local_58->namespace_prefix)._M_string_length,
                   *(FileDescriptor **)(this_00 + 0x30));
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        field = (FieldDescriptor *)(plVar5 + 2);
        if ((FieldDescriptor *)*plVar5 == field) {
          local_90 = *(ulong *)field;
          lStack_88 = plVar5[3];
          local_a0 = (FieldDescriptor *)&local_90;
        }
        else {
          local_90 = *(ulong *)field;
          local_a0 = (FieldDescriptor *)*plVar5;
        }
        local_98 = (GeneratorOptions *)plVar5[1];
        *plVar5 = (long)field;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        (anonymous_namespace)::JSObjectFieldName_abi_cxx11_(&local_80,this_00,local_98,field);
        uVar7 = 0xf;
        if (local_a0 != (FieldDescriptor *)&local_90) {
          uVar7 = local_90;
        }
        uVar2 = (long)&(local_98->output_dir)._M_dataplus._M_p + local_80._M_string_length;
        if (uVar7 < uVar2) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            uVar8 = local_80.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < uVar2) goto LAB_0021deca;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
        }
        else {
LAB_0021deca:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
        }
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_c0.field_2._M_allocated_capacity = *psVar1;
          local_c0.field_2._8_8_ = puVar6[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar1;
          local_c0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_c0._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        puVar6[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_a0 != (FieldDescriptor *)&local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_60,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      uVar9 = uVar9 + 1;
      ppFVar4 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(fields->
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3)
            );
  }
  return;
}

Assistant:

void Generator::FindProvidesForFields(
    const GeneratorOptions& options,
    io::Printer* printer,
    const std::vector<const FieldDescriptor*>& fields,
    std::set<string>* provided) const {
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (IgnoreField(field)) {
      continue;
    }

    string name = GetFilePath(options, field->file()) + "." +
                  JSObjectFieldName(options, field);
    provided->insert(name);
  }
}